

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O1

Vec_Int_t * Seg_ManCountIntEdges(Gia_Man_t *p,Vec_Int_t *vPolars,Vec_Int_t *vToSkip,int nFanouts)

{
  int iObj;
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                  ,0x53,
                  "Vec_Int_t *Seg_ManCountIntEdges(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  vPolars->nSize = 0;
  vToSkip->nSize = 0;
  if (nFanouts != 0) {
    Gia_ManSetLutRefs(p);
  }
  if (1 < p->nObjs) {
    lVar7 = 1;
    do {
      if (p->vMapping->nSize <= lVar7) {
LAB_007495e4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vMapping->pArray[lVar7] != 0) {
        pVVar4 = p->vMapping;
        lVar3 = (long)pVVar4->nSize;
        if (lVar3 <= lVar7) goto LAB_007495e4;
        lVar6 = 0;
        while( true ) {
          piVar2 = pVVar4->pArray;
          lVar5 = (long)piVar2[lVar7];
          if ((lVar5 < 0) || ((int)lVar3 <= piVar2[lVar7])) goto LAB_007495e4;
          if (piVar2[lVar5] <= lVar6) break;
          iObj = piVar2[lVar5 + lVar6 + 1];
          lVar3 = (long)iObj;
          if ((lVar3 < 0) || (p->nObjs <= iObj)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if ((~*(uint *)(p->pObjs + lVar3) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(p->pObjs + lVar3)) {
            if ((p->vEdge1 != (Vec_Int_t *)0x0) &&
               (iVar1 = Gia_ObjCheckEdge(p,iObj,(int)lVar7), iVar1 != 0)) {
              Vec_IntPush(vPolars,p_00->nSize / 2);
            }
            if (nFanouts != 0) {
              if (p->pLutRefs == (int *)0x0) {
                __assert_fail("p->pLutRefs",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x233,"int Gia_ObjLutRefNumId(Gia_Man_t *, int)");
              }
              if (nFanouts <= p->pLutRefs[lVar3]) {
                Vec_IntPush(vToSkip,p_00->nSize / 2);
              }
            }
            Vec_IntPush(p_00,iObj);
            Vec_IntPush(p_00,(int)lVar7);
          }
          lVar6 = lVar6 + 1;
          pVVar4 = p->vMapping;
          lVar3 = (long)pVVar4->nSize;
          if (lVar3 <= lVar7) goto LAB_007495e4;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < p->nObjs);
  }
  if ((nFanouts != 0) && (p->pLutRefs != (int *)0x0)) {
    free(p->pLutRefs);
    p->pLutRefs = (int *)0x0;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Seg_ManCountIntEdges( Gia_Man_t * p, Vec_Int_t * vPolars, Vec_Int_t * vToSkip, int nFanouts )
{
    int i, iLut, iFanin;
    Vec_Int_t * vEdges = Vec_IntAlloc( 1000 );
    assert( Gia_ManHasMapping(p) );
    Vec_IntClear( vPolars );
    Vec_IntClear( vToSkip );
    if ( nFanouts )
        Gia_ManSetLutRefs( p );
    Gia_ManForEachLut( p, iLut )
        Gia_LutForEachFanin( p, iLut, iFanin, i )
            if ( Gia_ObjIsAnd(Gia_ManObj(p, iFanin)) )
            {
                if ( p->vEdge1 && Gia_ObjCheckEdge(p, iFanin, iLut) )
                    Vec_IntPush( vPolars, Vec_IntSize(vEdges)/2 );
                if ( nFanouts && Gia_ObjLutRefNumId(p, iFanin) >= nFanouts )
                    Vec_IntPush( vToSkip, Vec_IntSize(vEdges)/2 );
                Vec_IntPushTwo( vEdges, iFanin, iLut );
            }
    if ( nFanouts )
        ABC_FREE( p->pLutRefs );
    return vEdges;
}